

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

fstream_t * el::base::utils::File::newFileStream(string *filename)

{
  char cVar1;
  fstream *this;
  
  this = (fstream *)operator_new(0x210);
  ::std::fstream::fstream(this,(filename->_M_dataplus)._M_p,_S_out|_S_app);
  cVar1 = ::std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 8))(this);
    this = (fstream *)0x0;
  }
  else {
    ::std::ostream::flush();
  }
  return (fstream_t *)this;
}

Assistant:

base::type::fstream_t* File::newFileStream(const std::string& filename) {
  base::type::fstream_t *fs = new base::type::fstream_t(filename.c_str(),
      base::type::fstream_t::out
#if !defined(ELPP_FRESH_LOG_FILE)
      | base::type::fstream_t::app
#endif
                                                       );
#if defined(ELPP_UNICODE)
  std::locale elppUnicodeLocale("");
#  if ELPP_OS_WINDOWS
  std::locale elppUnicodeLocaleWindows(elppUnicodeLocale, new std::codecvt_utf8_utf16<wchar_t>);
  elppUnicodeLocale = elppUnicodeLocaleWindows;
#  endif // ELPP_OS_WINDOWS
  fs->imbue(elppUnicodeLocale);
#endif  // defined(ELPP_UNICODE)
  if (fs->is_open()) {
    fs->flush();
  } else {
    base::utils::safeDelete(fs);
    ELPP_INTERNAL_ERROR("Bad file [" << filename << "]", true);
  }
  return fs;
}